

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_timer_fast.c
# Opt level: O0

int s_timer_comparator(RBTNode *a,RBTNode *b,void *arg)

{
  my_clock_diff_t diff;
  s_timer_t *timer_b;
  s_timer_t *timer_a;
  void *arg_local;
  RBTNode *b_local;
  RBTNode *a_local;
  
  a_local._4_4_ = *(int *)&a[1].left - *(int *)&b[1].left;
  if (a_local._4_4_ == 0) {
    if (*(ulong *)(a + 1) < *(ulong *)(b + 1)) {
      a_local._4_4_ = -1;
    }
    else if (*(ulong *)(b + 1) < *(ulong *)(a + 1)) {
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

int s_timer_comparator(const RBTNode* a, const RBTNode* b, void* arg) {
    s_timer_t* timer_a = GET_PARENT_ADDR(a, s_timer_t, rbt_node);
    s_timer_t* timer_b = GET_PARENT_ADDR(b, s_timer_t, rbt_node);
    (void)arg;

    my_clock_diff_t diff = (my_clock_diff_t)(timer_a->wakeup_ticks - timer_b->wakeup_ticks);
    if (diff != 0) {
        return (int)diff;
    }
    else {
        if (timer_a->task < timer_b->task)
            return -1;
        else if (timer_b->task < timer_a->task)
            return 1;
        else
            return 0;
    }
}